

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O0

bool xercesc_4_0::XMLChar1_1::isValidName(XMLCh *toCheck)

{
  XMLCh XVar1;
  bool bVar2;
  bool gotLeadingSurrogate;
  XMLCh *pXStack_20;
  XMLCh nextCh;
  XMLCh *curCh;
  XMLCh *toCheck_local;
  
  XVar1 = *toCheck;
  if (((ushort)XVar1 < 0xd800) || (0xdb7f < (ushort)XVar1)) {
    pXStack_20 = toCheck + 1;
    if (((&fgCharCharsTable1_1)[(ushort)XVar1] & 2) == 0) {
      return false;
    }
  }
  else {
    pXStack_20 = toCheck + 2;
    XVar1 = toCheck[1];
    if (((ushort)XVar1 < 0xdc00) || (0xdfff < (ushort)XVar1)) {
      return false;
    }
  }
  bVar2 = false;
  do {
    while( true ) {
      if (*pXStack_20 == L'\0') {
        return true;
      }
      XVar1 = *pXStack_20;
      if (((ushort)XVar1 < 0xd800) || (0xdbff < (ushort)XVar1)) break;
      if ((0xdb7f < (ushort)XVar1) || (bVar2)) {
        return false;
      }
      bVar2 = true;
      pXStack_20 = pXStack_20 + 1;
    }
    if (((ushort)XVar1 < 0xdc00) || (0xdfff < (ushort)XVar1)) {
      if (bVar2) {
        return false;
      }
      if (((&fgCharCharsTable1_1)[(ushort)XVar1] & 4) == 0) {
        return false;
      }
    }
    else if (!bVar2) {
      return false;
    }
    bVar2 = false;
    pXStack_20 = pXStack_20 + 1;
  } while( true );
}

Assistant:

bool XMLChar1_1::isValidName(const   XMLCh* const    toCheck)
{
    const XMLCh* curCh = toCheck;

    XMLCh nextCh = *curCh++;
    if ((nextCh >= 0xD800) && (nextCh <= 0xDB7F))
	{
        nextCh = *curCh++;
        if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
		{
            return false;
		}
    }
    else if (!(fgCharCharsTable1_1[nextCh] & gFirstNameCharMask))
	{
            return false;
	}

    bool    gotLeadingSurrogate = false;

    while (*curCh != 0)
    {
        nextCh = *curCh++;

        // Deal with surrogate pairs
        if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
        {
            //  It's a leading surrogate. If we already got one, then
            //  issue an error, else set leading flag to make sure that
            //  we look for a trailing next time.
            if (nextCh > 0xDB7F || gotLeadingSurrogate)
            {
                return false;
            }
            else
			{
                gotLeadingSurrogate = true;
			}
        }
        else
        {
            //  If it's a trailing surrogate, make sure that we are
            //  prepared for that. Else, it's just a regular char so make
            //  sure that we were not expected a trailing surrogate.
           if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
           {
                // It's trailing, so make sure we were expecting it
                if (!gotLeadingSurrogate)
                    return false;
            }
            else
            {
                //  It's just a char, so make sure we were not expecting a
                //  trailing surrogate.
                if (gotLeadingSurrogate)
				{
                    return false;
                }
                // It's got to at least be a valid XML character
                else if (!(fgCharCharsTable1_1[nextCh] & gNameCharMask))
                {
                    return false;
                }
            }
           gotLeadingSurrogate = false;
        }
    }
    return true;
}